

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * cinatra::base64_encode(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  char char_array_3 [3];
  char char_array_4 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar6 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  do {
    uVar2 = 0;
    do {
      iVar4 = (int)uVar2;
      bVar7 = sVar3 == 0;
      sVar3 = sVar3 - 1;
      if (bVar7) {
        if (iVar4 != 0) {
          for (; (int)uVar2 < 3; uVar2 = uVar2 + 1) {
            char_array_3[uVar2] = '\0';
          }
          char_array_4[0] = (byte)char_array_3[0] >> 2;
          char_array_4[1] = (char_array_3[0] & 3U) << 4 | (byte)char_array_3[1] >> 4;
          char_array_4[2] = (char_array_3[1] & 0xfU) << 2 | (byte)char_array_3[2] >> 6;
          char_array_4[3] = char_array_3[2] & 0x3f;
          for (lVar5 = 0; lVar5 <= iVar4; lVar5 = lVar5 + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,
                      *(char *)(base64_chars_abi_cxx11_ + char_array_4[lVar5]));
          }
          iVar4 = iVar4 + -1;
          while (iVar4 = iVar4 + 1, iVar4 < 3) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'=');
          }
        }
        return __return_storage_ptr__;
      }
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
      char_array_3[uVar2] = cVar1;
      uVar2 = (ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    char_array_4[0] = (byte)char_array_3[0] >> 2;
    char_array_4[1] = (char_array_3[0] & 3U) << 4 | (byte)char_array_3[1] >> 4;
    char_array_4[2] = (char_array_3[1] & 0xfU) << 2 | (byte)char_array_3[2] >> 6;
    char_array_4[3] = char_array_3[2] & 0x3f;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,*(char *)(base64_chars_abi_cxx11_ + char_array_4[lVar5]));
    }
  } while( true );
}

Assistant:

inline std::string base64_encode(const std::string &str) {
  std::string ret;
  int i = 0;
  int j = 0;
  char char_array_3[3];
  char char_array_4[4];

  auto bytes_to_encode = str.data();
  size_t in_len = str.size();
  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++) ret += base64_chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 3; j++) char_array_3[j] = '\0';

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++) ret += base64_chars[char_array_4[j]];

    while ((i++ < 3)) ret += '=';
  }

  return ret;
}